

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O1

void connect1_cb(uv_connect_t *req,int status)

{
  int iVar1;
  uv_timer_t *puVar2;
  uv_write_t *puVar3;
  uv_stream_t *puVar4;
  undefined1 local_18 [16];
  
  puVar4 = connect_req.handle;
  if (req == &connect_req) {
    puVar2 = (uv_timer_t *)req;
    if (status != 0) goto LAB_0017366d;
    connect_cb_called = connect_cb_called + 1;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&tm);
    if (iVar1 != 0) goto LAB_00173672;
    puVar2 = &tm;
    iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar1 != 0) goto LAB_00173677;
    local_18 = uv_buf_init("P",1);
    puVar3 = &write_req;
    iVar1 = uv_write(&write_req,puVar4,local_18,1,write1_cb);
    puVar2 = (uv_timer_t *)puVar3;
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar4,alloc_cb,read1_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00173681;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar2 = (uv_timer_t *)req;
LAB_0017366d:
    connect1_cb_cold_2();
LAB_00173672:
    connect1_cb_cold_3();
LAB_00173677:
    connect1_cb_cold_4();
  }
  puVar4 = (uv_stream_t *)puVar2;
  connect1_cb_cold_5();
LAB_00173681:
  connect1_cb_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar4,0);
  return;
}

Assistant:

static void connect1_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;
  uv_stream_t* stream;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  stream = req->handle;
  connect_cb_called++;

  r = uv_timer_init(uv_default_loop(), &tm);
  ASSERT(r == 0);

  r = uv_timer_start(&tm, timer_cb, 2000, 0);
  ASSERT(r == 0);

  buf = uv_buf_init("P", 1);
  r = uv_write(&write_req, stream, &buf, 1, write1_cb);
  ASSERT(r == 0);

  /* Start reading */
  r = uv_read_start(stream, alloc_cb, read1_cb);
  ASSERT(r == 0);
}